

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  TestRunInfo *pTVar1;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  Colour colour;
  Colour local_19;
  
  poVar5 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  psVar4 = getTildes_abi_cxx11_();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  Colour::Colour(&local_19,FileName);
  pTVar1 = (this->super_StreamingReporterBase).testRunInfo.nullableValue;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).stream,(pTVar1->name)._M_dataplus._M_p,
                      (pTVar1->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," is a Catch v",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," b",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  iVar3 = std::__cxx11::string::compare((char *)&DAT_00167440);
  if (iVar3 != 0) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,DAT_00167440,DAT_00167448);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  }
  poVar5 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," host application.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Run with -? for options\n\n",0x19);
  pTVar1 = (this->super_StreamingReporterBase).testRunInfo.nullableValue;
  if ((pTVar1 != (TestRunInfo *)0x0) &&
     (pcVar2 = (pTVar1->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pTVar1->name).field_2)) {
    operator_delete(pcVar2);
  }
  (this->super_StreamingReporterBase).testRunInfo.nullableValue = (TestRunInfo *)0x0;
  Colour::~Colour(&local_19);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getTildes() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << testRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != "master" )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            testRunInfo.reset();
        }